

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O1

void tcu::astc::generateBlockCaseTestData
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *dst,
               CompressedTexFormat format,BlockTestType testType)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  deFloat16 dVar5;
  deFloat16 dVar6;
  deFloat16 dVar7;
  deFloat16 dVar8;
  uint uVar9;
  ISEMode IVar10;
  int iVar11;
  undefined1 *puVar12;
  ISEParams IVar13;
  NormalBlockISEInputs *extraout_RAX;
  byte bVar14;
  int endpointNdx;
  uint *iseInputs_00;
  int blockHeight;
  int blockHeight_00;
  int blockHeight_01;
  int blockHeight_02;
  int iVar15;
  int extraout_EDX;
  int blockHeight_03;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  ulong uVar16;
  ulong extraout_RDX_01;
  ulong uVar17;
  ulong extraout_RDX_02;
  uint uVar18;
  NormalBlockISEInputs *pNVar19;
  NormalBlockISEInputs *pNVar20;
  int weightGridHeight;
  int iVar21;
  uint uVar22;
  NormalBlockISEInputs *pNVar23;
  int blockNdx;
  ISEMode IVar24;
  long lVar25;
  undefined8 uVar26;
  deUint32 ccs;
  deUint32 dVar27;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *dst_00;
  deUint32 partitionSeed;
  int iVar28;
  NormalBlockISEInputs *pNVar29;
  long lVar30;
  deUint32 *__s;
  bool bVar31;
  NormalBlockParams blockParams;
  int numColorEndpoints;
  IVec3 blockSize;
  NormalBlockISEInputs iseInputs;
  long local_d20;
  undefined1 local_d14 [28];
  undefined1 local_cf8 [4];
  undefined1 auStack_cf4 [92];
  deUint32 local_c98;
  undefined4 uStack_c94;
  int local_c90;
  undefined4 uStack_c8c;
  undefined4 local_c88;
  tcu local_c84 [36];
  bool local_c60;
  undefined7 uStack_c5f;
  undefined8 local_c58;
  undefined8 local_c50;
  undefined8 local_c48;
  undefined8 local_c40;
  NormalBlockISEInputs local_c38;
  
  auStack_cf4._36_8_ = dst;
  getBlockPixelSize(local_c84,format);
  uVar26 = auStack_cf4._36_8_;
  iseInputs_00 = &switchD_0060d99c::switchdataD_006a32a0;
  switch(testType) {
  case BLOCK_TEST_TYPE_VOID_EXTENT_LDR:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_cf4._36_8_,0x20000);
    uVar17 = 0;
    do {
      iVar28 = (int)(uVar17 * 0x80041 >> 0x20);
      uVar9 = ((uint)((int)uVar17 - iVar28) >> 1) + iVar28 >> 0xc;
      local_c38.weight.value._4_8_ =
           (ulong)(uVar9 - 0x4000) << 0x30 |
           (CONCAT44(uVar9,uVar9 * 0x10000 + (uVar9 & 0xffff) + 0x40000000) ^ 0x800000000000) &
           0xffffffffffff;
      local_c38.weight._0_8_ = 0xfffffffffffffdfc;
      anon_unknown_0::AssignBlock128::pushBytesToVector
                ((AssignBlock128 *)&local_c38,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_cf4._36_8_);
      uVar9 = (int)uVar17 + 0xffff;
      uVar17 = (ulong)uVar9;
    } while (uVar9 != 0x1fffe000);
    break;
  case BLOCK_TEST_TYPE_VOID_EXTENT_HDR:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_cf4._36_8_,0x20000);
    uVar9 = 0;
    do {
      dVar5 = deFloat32To16(((float)(int)uVar9 * 131008.0) / 8191.0 + -65504.0);
      dVar6 = deFloat32To16((float)((uVar9 + 0x800 & 0x1fff) * 0x1ffc0) / 8191.0 + -65504.0);
      dVar7 = deFloat32To16(((float)(int)(uVar9 ^ 0x1000) * 131008.0) / 8191.0 + -65504.0);
      dVar8 = deFloat32To16((float)((uVar9 + 0x1800 & 0x1fff) * 0x1ffc0) / 8191.0 + -65504.0);
      local_c38.weight.value._4_8_ = CONCAT26(dVar8,CONCAT24(dVar7,CONCAT22(dVar6,dVar5)));
      local_c38.weight._0_8_ = 0xfffffffffffffffc;
      anon_unknown_0::AssignBlock128::pushBytesToVector
                ((AssignBlock128 *)&local_c38,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_cf4._36_8_);
      uVar9 = uVar9 + 1;
    } while (uVar9 != 0x2000);
    break;
  case BLOCK_TEST_TYPE_WEIGHT_GRID:
    iVar28 = 0;
    do {
      pNVar23 = (NormalBlockISEInputs *)0x0;
      do {
        IVar13 = *(ISEParams *)(&(anonymous_namespace)::s_weightISEParamsCandidates + (long)pNVar23)
        ;
        iVar11 = 2;
        pNVar19 = pNVar23;
        do {
          iVar21 = 2;
          do {
            auStack_cf4[0xc] = false;
            auStack_cf4._16_4_ = 0xffffffff;
            auStack_cf4._4_4_ = 0;
            auStack_cf4._8_4_ = 0;
            local_d14._4_4_ = iVar21;
            local_d14._0_4_ = iVar11;
            local_d14[0x10] = (undefined1)iVar28;
            local_d14._20_4_ = 0;
            local_d14._24_4_ = 1;
            _local_cf8 = 0;
            local_d14._8_8_ = IVar13;
            bVar31 = anon_unknown_0::isValidBlockParams
                               ((NormalBlockParams *)local_d14,local_c84._0_4_,local_c84._4_4_);
            if (bVar31) {
              anon_unknown_0::generateDefaultISEInputs(&local_c38,(NormalBlockParams *)local_d14);
              auStack_cf4._52_16_ =
                   (undefined1  [16])
                   anon_unknown_0::generateNormalBlock
                             ((NormalBlockParams *)local_d14,(int)&local_c38,blockHeight,pNVar19);
              anon_unknown_0::AssignBlock128::pushBytesToVector
                        ((AssignBlock128 *)(auStack_cf4 + 0x34),
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_cf4._36_8_
                        );
            }
            iVar21 = iVar21 + 1;
          } while (iVar21 != 0xd);
          iVar11 = iVar11 + 1;
        } while (iVar11 != 0xd);
        pNVar23 = (NormalBlockISEInputs *)&(pNVar23->weight).field_0x1;
      } while (pNVar23 != (NormalBlockISEInputs *)0xc);
      bVar31 = iVar28 == 0;
      iVar28 = iVar28 + 1;
    } while (bVar31);
    break;
  case BLOCK_TEST_TYPE_WEIGHT_ISE:
    uVar17 = 0;
    do {
      uVar3 = local_c84._4_4_;
      uVar2 = local_c84._0_4_;
      auStack_cf4[0xc] = false;
      auStack_cf4._16_4_ = 0xffffffff;
      auStack_cf4._4_4_ = 0;
      auStack_cf4._8_4_ = 0;
      local_d14._0_4_ = 4;
      local_d14._4_4_ = 4;
      local_d14._8_8_ = *(ISEParams *)(&(anonymous_namespace)::s_weightISEParamsCandidates + uVar17)
      ;
      local_d14[0x10] = true;
      local_d14._20_4_ = 0;
      local_d14._24_4_ = 1;
      _local_cf8 = 0;
      bVar31 = anon_unknown_0::isValidBlockParams
                         ((NormalBlockParams *)local_d14,local_c84._0_4_,local_c84._4_4_);
      if (!bVar31) {
        iVar28 = local_d14._4_4_;
        iVar11 = local_d14._0_4_;
        do {
          iVar11 = iVar11 + -1;
          iVar28 = iVar28 + -1;
          local_d14._4_4_ = iVar28;
          local_d14._0_4_ = iVar11;
          bVar31 = anon_unknown_0::isValidBlockParams((NormalBlockParams *)local_d14,uVar2,uVar3);
        } while (!bVar31);
      }
      auStack_cf4._32_4_ = 0;
      auStack_cf4._28_4_ = *(uint *)(&(anonymous_namespace)::s_weightISEParamsCandidates + uVar17);
      uVar9 = ((ISEParams)auStack_cf4._28_8_ == (ISEParams)0x1) + 1 +
              (uint)((ISEParams)auStack_cf4._28_8_ == (ISEParams)0x1);
      if ((ISEParams)auStack_cf4._28_8_ == (ISEParams)0x0) {
        uVar9 = 5;
      }
      auStack_cf4._68_8_ = ZEXT48(uVar9);
      iVar28 = 0;
      pNVar23 = (NormalBlockISEInputs *)auStack_cf4._68_8_;
      if ((ulong)auStack_cf4._28_8_ < 3) {
        bVar14 = *(byte *)((long)&(anonymous_namespace)::s_weightISEParamsCandidates +
                          uVar17 * 8 + 4);
        pNVar23 = (NormalBlockISEInputs *)(ulong)bVar14;
        iVar28 = *(int *)(&DAT_006a5c14 + auStack_cf4._28_8_ * 4) << (bVar14 & 0x1f);
      }
      uVar9 = local_d14._0_4_ * local_d14._4_4_ * 2;
      iVar11 = (iVar28 / (int)uVar9 + 1) - (uint)(iVar28 % (int)uVar9 == 0);
      auStack_cf4._20_8_ = uVar17;
      anon_unknown_0::generateDefaultISEInputs(&local_c38,(NormalBlockParams *)local_d14);
      local_c38.weight._0_8_ = local_c38.weight._0_8_ & 0xffffffffffffff00;
      local_d20 = 0;
      uVar26 = extraout_RDX;
      do {
        if (0 < iVar11) {
          iVar21 = 0;
          lVar30 = local_d20;
          do {
            iVar15 = (int)uVar26;
            if (0 < (int)uVar9) {
              pNVar23 = (NormalBlockISEInputs *)0x0;
              do {
                iVar15 = ((int)lVar30 + (int)pNVar23) % iVar28;
                *(int *)((long)&local_c38.weight.value + (long)pNVar23 * 4) = iVar15;
                pNVar23 = (NormalBlockISEInputs *)((long)pNVar23 + 1);
              } while ((NormalBlockISEInputs *)(ulong)uVar9 != pNVar23);
            }
            auStack_cf4._52_16_ =
                 (undefined1  [16])
                 anon_unknown_0::generateNormalBlock
                           ((NormalBlockParams *)local_d14,(int)&local_c38,iVar15,pNVar23);
            anon_unknown_0::AssignBlock128::pushBytesToVector
                      ((AssignBlock128 *)(auStack_cf4 + 0x34),
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_cf4._36_8_);
            iVar21 = iVar21 + 1;
            lVar30 = (ulong)uVar9 + lVar30;
            uVar26 = extraout_RDX_00;
          } while (iVar21 != iVar11);
        }
        local_d20 = local_d20 + 1;
      } while ((deUint32)local_d20 != auStack_cf4._68_4_);
      if ((ISEMode)auStack_cf4._28_8_ < ISEMODE_PLAIN_BIT) {
        bVar31 = (ISEParams)auStack_cf4._28_8_ == (ISEParams)0x0;
        anon_unknown_0::generateDefaultISEInputs(&local_c38,(NormalBlockParams *)local_d14);
        local_c38.weight.isGivenInBlockForm = true;
        iVar28 = (int)auStack_cf4._68_8_;
        uVar18 = (uint)bVar31 * 0x80 + 0x80;
        uVar9 = ((int)uVar9 / iVar28 + 1) - (uint)((int)uVar9 % iVar28 == 0);
        uVar26 = ZEXT48(uVar9);
        uVar17 = (long)(ulong)uVar18 % (long)(int)uVar9;
        uVar16 = uVar17 & 0xffffffff;
        _local_c98 = _local_c98 & 0xffffffff00000000;
        auStack_cf4._44_4_ =
             ((int)((long)(ulong)uVar18 / (long)(int)uVar9) + 1) - (uint)((int)uVar17 == 0);
        lVar30 = uVar26 * 0x18;
        _local_c90 = uVar26;
        do {
          if (0 < (int)auStack_cf4._44_4_) {
            IVar10 = ISEMODE_TRIT;
            pNVar23 = (NormalBlockISEInputs *)(_local_c98 & 0xffffffff);
            auStack_cf4._28_4_ = local_c98;
            do {
              iVar11 = (int)uVar16;
              if (0 < (int)uVar26) {
                lVar25 = 0;
                IVar24 = auStack_cf4._28_4_;
                do {
                  memset((void *)((long)&local_c38.weight.value + lVar25 + 4),0,
                         (ulong)(uint)(iVar28 * 4));
                  iVar11 = (int)IVar24 % (int)uVar18;
                  *(int *)((long)&local_c38.weight.value + lVar25) = iVar11;
                  lVar25 = lVar25 + 0x18;
                  IVar24 = IVar24 + ISEMODE_QUINT;
                } while (lVar30 != lVar25);
              }
              auStack_cf4._52_16_ =
                   (undefined1  [16])
                   anon_unknown_0::generateNormalBlock
                             ((NormalBlockParams *)local_d14,(int)&local_c38,iVar11,pNVar23);
              anon_unknown_0::AssignBlock128::pushBytesToVector
                        ((AssignBlock128 *)(auStack_cf4 + 0x34),
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_cf4._36_8_
                        );
              IVar10 = IVar10 + ISEMODE_QUINT;
              auStack_cf4._28_4_ = auStack_cf4._28_4_ + (int)_local_c90;
              uVar16 = extraout_RDX_01;
              uVar26 = _local_c90;
            } while (IVar10 != auStack_cf4._44_4_);
          }
          dVar27 = local_c98 + 1;
          local_c98 = dVar27;
        } while (dVar27 != auStack_cf4._68_4_);
      }
      uVar17 = auStack_cf4._20_8_ + 1;
    } while (uVar17 != 0xc);
    break;
  case BLOCK_TEST_TYPE_CEMS:
    uVar9 = 0;
    do {
      auStack_cf4._84_8_ = (ulong)(uVar9 == 0) + 4;
      _local_c90 = 1;
      lVar30 = 0;
      auStack_cf4._68_8_ = (ulong)uVar9;
      do {
        auStack_cf4._20_4_ = 1;
        if (1 < (ulong)_local_c90) {
          uVar9 = 0;
          do {
            uVar3 = local_c84._4_4_;
            uVar2 = local_c84._0_4_;
            auStack_cf4._4_4_ = 0;
            auStack_cf4._8_4_ = 0;
            pNVar23 = (NormalBlockISEInputs *)0x400000004;
            local_d14._0_4_ = 4;
            local_d14._4_4_ = 4;
            local_d14[0x10] = (undefined1)auStack_cf4._68_8_;
            local_d14._20_8_ = _local_c90 << 0x20;
            auStack_cf4[0xc] = true;
            _local_cf8 = (ulong)uVar9;
            auStack_cf4._16_4_ = 0x27a;
            lVar25 = 0;
            do {
              local_d14._8_8_ =
                   *(ISEParams *)
                    ((long)&(anonymous_namespace)::s_weightISEParamsCandidates + lVar25);
              bVar31 = anon_unknown_0::isValidBlockParams
                                 ((NormalBlockParams *)local_d14,uVar2,uVar3);
              if (bVar31) {
                anon_unknown_0::generateDefaultISEInputs(&local_c38,(NormalBlockParams *)local_d14);
                auStack_cf4._52_16_ =
                     (undefined1  [16])
                     anon_unknown_0::generateNormalBlock
                               ((NormalBlockParams *)local_d14,(int)&local_c38,blockHeight_00,
                                pNVar23);
                anon_unknown_0::AssignBlock128::pushBytesToVector
                          ((AssignBlock128 *)(auStack_cf4 + 0x34),
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           auStack_cf4._36_8_);
                break;
              }
              lVar25 = lVar25 + 8;
            } while (lVar25 != 0x60);
            uVar9 = uVar9 + 1;
          } while (uVar9 != 0x10);
          auStack_cf4._20_4_ = 0x10;
        }
        auStack_cf4._44_8_ = auStack_cf4._44_8_ & 0xffffffff00000000;
        _local_c98 = (NormalBlockISEInputs *)
                     (&(((NormalBlockISEInputs *)local_cf8)->weight).isGivenInBlockForm +
                     _local_c90 * 4);
        do {
          auStack_cf4._28_8_ = auStack_cf4._28_8_ & 0xffffffff00000000;
          do {
            uVar9 = 0;
            do {
              uVar18 = 0;
              do {
                uVar3 = local_c84._4_4_;
                uVar2 = local_c84._0_4_;
                pNVar29 = (NormalBlockISEInputs *)(local_cf8 + 4);
                local_d14._0_4_ = 4;
                local_d14._4_4_ = 4;
                local_d14[0x10] = (undefined1)auStack_cf4._68_8_;
                local_d14._20_8_ = _local_c90 << 0x20;
                auStack_cf4[0xc] = false;
                unique0x10000e94 = auStack_cf4._28_4_;
                local_cf8 = (ISEMode)auStack_cf4._44_8_;
                auStack_cf4._4_4_ = uVar9;
                auStack_cf4._8_4_ = uVar18;
                auStack_cf4._16_4_ = 0x27a;
                lVar25 = lVar30;
                pNVar23 = pNVar29;
                pNVar19 = (NormalBlockISEInputs *)local_cf8;
                pNVar20 = (NormalBlockISEInputs *)local_cf8;
                if (pNVar29 != (NormalBlockISEInputs *)_local_c98) {
                  do {
                    pNVar19 = pNVar23;
                    if (*(uint *)&pNVar20->weight <= *(uint *)&pNVar23->weight) {
                      pNVar19 = pNVar20;
                    }
                    lVar25 = lVar25 + -4;
                    pNVar23 = (NormalBlockISEInputs *)&(pNVar23->weight).value;
                    pNVar20 = pNVar19;
                  } while (lVar25 != 0);
                }
                pNVar23 = (NormalBlockISEInputs *)local_cf8;
                if (pNVar29 != (NormalBlockISEInputs *)_local_c98) {
                  lVar25 = 0;
                  do {
                    if (*(uint *)&pNVar23->weight < *(uint *)(local_cf8 + lVar25 + 4)) {
                      pNVar23 = (NormalBlockISEInputs *)
                                (&(pNVar29->weight).isGivenInBlockForm + lVar25);
                    }
                    lVar25 = lVar25 + 4;
                  } while (lVar30 != lVar25);
                }
                uVar22 = (*(uint *)&pNVar23->weight >> 2) - (*(uint *)&pNVar19->weight >> 2);
                pNVar23 = (NormalBlockISEInputs *)(ulong)uVar22;
                if (uVar22 < 2) {
                  lVar25 = 0;
                  do {
                    local_d14._8_8_ =
                         *(ISEParams *)
                          ((long)&(anonymous_namespace)::s_weightISEParamsCandidates + lVar25);
                    bVar31 = anon_unknown_0::isValidBlockParams
                                       ((NormalBlockParams *)local_d14,uVar2,uVar3);
                    if (bVar31) {
                      anon_unknown_0::generateDefaultISEInputs
                                (&local_c38,(NormalBlockParams *)local_d14);
                      auStack_cf4._52_16_ =
                           (undefined1  [16])
                           anon_unknown_0::generateNormalBlock
                                     ((NormalBlockParams *)local_d14,(int)&local_c38,blockHeight_01,
                                      pNVar23);
                      anon_unknown_0::AssignBlock128::pushBytesToVector
                                ((AssignBlock128 *)(auStack_cf4 + 0x34),
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 auStack_cf4._36_8_);
                      break;
                    }
                    lVar25 = lVar25 + 8;
                  } while (lVar25 != 0x60);
                }
              } while ((3 < (ulong)_local_c90) &&
                      (bVar31 = uVar18 < 0xf, uVar18 = uVar18 + 1, bVar31));
            } while ((2 < (ulong)_local_c90) && (bVar31 = uVar9 < 0xf, uVar9 = uVar9 + 1, bVar31));
            IVar10 = auStack_cf4._28_4_ + ISEMODE_QUINT;
            auStack_cf4._28_4_ = IVar10;
          } while (IVar10 != auStack_cf4._20_4_);
          IVar10 = auStack_cf4._44_4_ + ISEMODE_QUINT;
          auStack_cf4._44_4_ = IVar10;
        } while (IVar10 != 0x10);
        _local_c90 = _local_c90 + 1;
        lVar30 = lVar30 + 4;
      } while (_local_c90 != auStack_cf4._84_8_);
      uVar9 = (int)auStack_cf4._68_8_ + 1;
    } while ((int)auStack_cf4._68_8_ == 0);
    break;
  case BLOCK_TEST_TYPE_PARTITION_SEED:
    iVar28 = 2;
    do {
      dVar27 = 0;
      do {
        auStack_cf4._4_4_ = 0;
        auStack_cf4._8_4_ = 0;
        local_d14._0_4_ = 4;
        local_d14._4_4_ = 4;
        local_d14._8_4_ = ISEMODE_PLAIN_BIT;
        local_d14._12_4_ = 2;
        local_d14[0x10] = false;
        local_d14._24_4_ = iVar28;
        local_d14._20_4_ = 0xffffffff;
        auStack_cf4[0xc] = true;
        _local_cf8 = 0;
        auStack_cf4._16_4_ = dVar27;
        anon_unknown_0::generateDefaultISEInputs(&local_c38,(NormalBlockParams *)local_d14);
        auStack_cf4._52_16_ =
             (undefined1  [16])
             anon_unknown_0::generateNormalBlock
                       ((NormalBlockParams *)local_d14,(int)&local_c38,blockHeight_02,
                        (NormalBlockISEInputs *)iseInputs_00);
        anon_unknown_0::AssignBlock128::pushBytesToVector
                  ((AssignBlock128 *)(auStack_cf4 + 0x34),
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_cf4._36_8_);
        dVar27 = dVar27 + 1;
      } while (dVar27 != 0x400);
      iVar28 = iVar28 + 1;
    } while (iVar28 != 5);
    break;
  case BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR:
  case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15:
  case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15:
    uVar9 = 0;
    local_c88 = testType;
    do {
      uVar18 = uVar9 & 0xe;
      if ((testType != BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR) ||
         (uVar18 != 0xe && ((uVar9 != 0xb && uVar9 != 7) && uVar18 != 2))) {
        if ((testType != BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15 || uVar9 == 0xf) &&
           (testType != BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15 ||
            uVar9 != 0xf && (uVar18 == 0xe || ((uVar9 == 0xb || uVar9 == 7) || uVar18 == 2)))) {
          auStack_cf4[0xc] = false;
          auStack_cf4._16_4_ = 0xffffffff;
          auStack_cf4._4_4_ = 0;
          auStack_cf4._8_4_ = 0;
          local_d14._0_4_ = 3;
          local_d14._4_4_ = 4;
          local_d14._8_4_ = ISEMODE_PLAIN_BIT;
          local_d14._12_4_ = 2;
          local_d14[0x10] = false;
          local_d14._20_4_ = 0xffffffff;
          local_d14._24_4_ = 1;
          _local_cf8 = (ulong)uVar9;
          uVar18 = (uVar9 >> 1 & 6) + 2;
          IVar13 = anon_unknown_0::computeMaximumRangeISEParams(0x57,uVar18);
          IVar10 = IVar13.mode;
          if (IVar10 == ISEMODE_PLAIN_BIT) {
            auStack_cf4._28_4_ = ~(-1 << ((byte)IVar13.numBits & 0x1f));
            auStack_cf4._32_4_ = 0;
          }
          else {
            if (IVar10 == ISEMODE_QUINT) {
              iVar28 = 5;
            }
            else {
              auStack_cf4._28_4_ = ~ISEMODE_TRIT;
              auStack_cf4._32_4_ = 0;
              if (IVar10 != ISEMODE_TRIT) goto LAB_0060dad9;
              iVar28 = 3;
            }
            auStack_cf4._28_4_ = (iVar28 << ((byte)IVar13.numBits & 0x1f)) - 1;
            auStack_cf4._32_4_ = 0;
          }
LAB_0060dad9:
          uVar22 = (ISEMode)auStack_cf4._28_8_ + ISEMODE_QUINT;
          if (9 < (int)uVar22) {
            uVar22 = 10;
          }
          uVar17 = (ulong)uVar22;
          auStack_cf4._84_8_ = ZEXT48(uVar18);
          _local_c60 = ZEXT48((uVar9 >> 1 & 0x3ffffffe) + 2);
          local_c84._20_8_ = (NormalBlockISEInputs *)0x1;
          local_c84._12_8_ = (NormalBlockISEInputs *)0x0;
          auStack_cf4._44_4_ = uVar22 - ISEMODE_QUINT;
          auStack_cf4._20_8_ = uVar17;
          auStack_cf4._80_4_ = uVar9;
          do {
            puVar12 = &(((NormalBlockISEInputs *)local_c84._12_8_)->weight).field_0x1;
            pNVar23 = (NormalBlockISEInputs *)local_c84._20_8_;
            _local_c98 = local_c84._12_8_;
            local_c84._12_8_ = puVar12;
            if (puVar12 < (ulong)auStack_cf4._84_8_) {
              do {
                auStack_cf4._68_8_ = pNVar23;
                anon_unknown_0::generateDefaultISEInputs(&local_c38,(NormalBlockParams *)local_d14);
                if ((ISEMode)auStack_cf4._28_8_ < 0x7fffffff) {
                  iVar28 = 0;
                  do {
                    uVar1 = _local_c98;
                    uVar26 = auStack_cf4._68_8_;
                    local_c90 = iVar28;
                    uVar9 = (int)(iVar28 * (ISEMode)auStack_cf4._28_8_) / (int)auStack_cf4._44_4_;
                    iVar28 = 0;
                    uVar17 = uVar17 & 0xffffffff;
                    IVar10 = auStack_cf4._44_4_;
                    do {
                      *(uint *)((long)&local_c38.endpoint.value + uVar1 * 4) = uVar9;
                      *(int *)((long)&local_c38.endpoint.value + uVar26 * 4) = iVar28 / (int)IVar10;
                      auStack_cf4._52_16_ =
                           (undefined1  [16])
                           anon_unknown_0::generateNormalBlock
                                     ((NormalBlockParams *)local_d14,(int)&local_c38,
                                      iVar28 % (int)IVar10,(NormalBlockISEInputs *)(ulong)uVar9);
                      anon_unknown_0::AssignBlock128::pushBytesToVector
                                ((AssignBlock128 *)(auStack_cf4 + 0x34),
                                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 auStack_cf4._36_8_);
                      iVar28 = iVar28 + (ISEMode)auStack_cf4._28_8_;
                      uVar18 = (int)uVar17 - 1;
                      uVar17 = (ulong)uVar18;
                      IVar10 = auStack_cf4._44_4_;
                    } while (uVar18 != 0);
                    iVar28 = local_c90 + 1;
                    uVar17 = auStack_cf4._20_8_;
                  } while (iVar28 != (int)auStack_cf4._20_8_);
                }
                pNVar23 = (NormalBlockISEInputs *)(auStack_cf4._68_8_ + 1);
              } while ((NormalBlockISEInputs *)(auStack_cf4._68_8_ + 1) < (ulong)auStack_cf4._84_8_)
              ;
            }
            local_c84._20_8_ = local_c84._20_8_ + 1;
            uVar9 = auStack_cf4._80_4_;
            testType = local_c88;
          } while (local_c84._12_8_ != _local_c60);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != 0x10);
    break;
  case BLOCK_TEST_TYPE_ENDPOINT_ISE:
    local_c50 = 0;
    do {
      pNVar23 = (NormalBlockISEInputs *)0x8;
      auStack_cf4._20_8_ = auStack_cf4._20_8_ & 0xffffffff00000000;
      uVar26 = 1;
      dst_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_cf4._36_8_;
      do {
        if ((auStack_cf4._20_8_ & 1) == 0) {
          local_c48 = 0xffffffe3;
          if ((int)uVar26 == 1) {
            local_c48 = 0xffffffef;
          }
          auStack_cf4._80_4_ = (int)uVar26 * 8;
          local_c40 = 0;
          local_c58 = uVar26;
          do {
            if ((auStack_cf4._20_8_ & 1) == 0) {
              bVar31 = (int)local_c40 == 0;
              local_c60 = !bVar31;
              local_c88 = (int)local_c48 + (uint)bVar31 * 2 + 0x7e;
              local_c84[0x1c] = (tcu)0x0;
              local_c84[0x1d] = (tcu)0x0;
              local_c84[0x1e] = (tcu)0x0;
              local_c84[0x1f] = (tcu)0x0;
              local_c84[0x20] = (tcu)0x0;
              local_c84[0x21] = (tcu)0x0;
              local_c84[0x22] = (tcu)0x0;
              local_c84[0x23] = (tcu)0x0;
              do {
                if ((auStack_cf4._20_8_ & 1) == 0) {
                  local_c84._12_8_ = 2;
                  do {
                    if ((auStack_cf4._20_8_ & 1) == 0) {
                      local_c84._20_8_ =
                           *(ISEParams *)
                            (&(anonymous_namespace)::s_weightISEParamsCandidates + local_c84._28_8_)
                      ;
                      pNVar19 = (NormalBlockISEInputs *)0x2;
                      do {
                        auStack_cf4[0xc] = true;
                        auStack_cf4._4_4_ = 0;
                        auStack_cf4._8_4_ = 0;
                        iVar28 = (int)local_c84._12_8_;
                        local_d14._4_4_ = (int)pNVar19;
                        local_d14._0_4_ = iVar28;
                        local_d14[8] = local_c84[0x14];
                        local_d14[9] = local_c84[0x15];
                        local_d14[10] = local_c84[0x16];
                        local_d14[0xb] = local_c84[0x17];
                        local_d14[0xc] = local_c84[0x18];
                        local_d14[0xd] = local_c84[0x19];
                        local_d14[0xe] = local_c84[0x1a];
                        local_d14[0xf] = local_c84[0x1b];
                        bVar31 = local_c60;
                        local_d14[0x10] = local_c60;
                        local_d14._20_8_ = uVar26 << 0x20;
                        _local_cf8 = 0xc;
                        auStack_cf4._16_4_ = 0x27a;
                        bVar4 = anon_unknown_0::isValidBlockParams
                                          ((NormalBlockParams *)local_d14,local_c84._0_4_,
                                           local_c84._4_4_);
                        pNVar20 = pNVar19;
                        if (bVar4) {
                          iVar28 = (int)pNVar19 * iVar28 << (bVar31 & 0x1fU);
                          if (local_d14._8_4_ == ISEMODE_PLAIN_BIT) {
                            iVar11 = iVar28 * local_d14._12_4_;
                          }
                          else {
                            if (local_d14._8_4_ == ISEMODE_QUINT) {
                              iVar11 = (iVar28 * 7) / 3;
                              bVar31 = iVar28 * -0x55555553 + 0x2aaaaaaaU < 0x55555555;
                            }
                            else {
                              iVar11 = -1;
                              if (local_d14._8_4_ != ISEMODE_TRIT) goto LAB_0060e907;
                              iVar11 = (iVar28 * 8) / 5;
                              bVar31 = iVar28 * 0x66666668 + 0x19999999U < 0x33333333;
                            }
                            iVar11 = iVar28 * local_d14._12_4_ + ((iVar11 + 1) - (uint)bVar31);
                          }
LAB_0060e907:
                          auStack_cf4._84_8_ = pNVar19;
                          IVar13 = anon_unknown_0::computeMaximumRangeISEParams
                                             (local_c88 - iVar11,auStack_cf4._80_4_);
                          IVar10 = IVar13.mode;
                          bVar14 = (byte)IVar13.numBits;
                          if (IVar10 == ISEMODE_PLAIN_BIT) {
                            dVar27 = ~(-1 << (bVar14 & 0x1f));
                          }
                          else {
                            if (IVar10 == ISEMODE_QUINT) {
                              iVar28 = 5;
                            }
                            else {
                              dVar27 = 0xffffffff;
                              if (IVar10 != ISEMODE_TRIT) goto LAB_0060e971;
                              iVar28 = 3;
                            }
                            dVar27 = (iVar28 << (bVar14 & 0x1f)) - 1;
                          }
LAB_0060e971:
                          pNVar20 = (NormalBlockISEInputs *)auStack_cf4._84_8_;
                          if (dVar27 == generateBlockCaseTestData::endpointRangeMaximums[local_c50])
                          {
                            uVar9 = (uint)(IVar10 == ISEMODE_QUINT) * 2 + 1;
                            if (IVar10 == ISEMODE_TRIT) {
                              uVar9 = 5;
                            }
                            auStack_cf4._32_4_ = 0;
                            auStack_cf4._28_4_ = uVar9;
                            if (IVar10 == ISEMODE_PLAIN_BIT) {
                              iVar28 = 1;
LAB_0060e9d2:
                              iVar28 = iVar28 << (bVar14 & 0x1f);
                            }
                            else {
                              if (IVar10 == ISEMODE_QUINT) {
                                iVar28 = 5;
                                goto LAB_0060e9d2;
                              }
                              iVar28 = 0;
                              if (IVar10 == ISEMODE_TRIT) {
                                iVar28 = 3;
                                goto LAB_0060e9d2;
                              }
                            }
                            iVar11 = (iVar28 / (int)auStack_cf4._80_4_ + 1) -
                                     (uint)(iVar28 % (int)auStack_cf4._80_4_ == 0);
                            auStack_cf4._44_8_ = IVar13;
                            pNVar19 = anon_unknown_0::generateDefaultISEInputs
                                                (&local_c38,(NormalBlockParams *)local_d14);
                            local_c38.endpoint.isGivenInBlockForm = false;
                            lVar30 = 0;
                            do {
                              if (0 < iVar11) {
                                iVar21 = 0;
                                lVar25 = lVar30;
                                do {
                                  pNVar19 = (NormalBlockISEInputs *)0x0;
                                  do {
                                    iVar15 = ((int)lVar25 + (int)pNVar19) % iVar28;
                                    *(int *)((long)&local_c38.endpoint.value + (long)pNVar19 * 4) =
                                         iVar15;
                                    pNVar19 = (NormalBlockISEInputs *)((long)&pNVar19->weight + 1);
                                  } while (pNVar23 != pNVar19);
                                  auStack_cf4._52_16_ =
                                       (undefined1  [16])
                                       anon_unknown_0::generateNormalBlock
                                                 ((NormalBlockParams *)local_d14,(int)&local_c38,
                                                  iVar15,pNVar19);
                                  anon_unknown_0::AssignBlock128::pushBytesToVector
                                            ((AssignBlock128 *)(auStack_cf4 + 0x34),dst_00);
                                  iVar21 = iVar21 + 1;
                                  lVar25 = (long)&pNVar23->weight + lVar25;
                                  pNVar19 = extraout_RAX;
                                } while (iVar21 != iVar11);
                              }
                              lVar30 = lVar30 + 1;
                            } while ((ISEMode)lVar30 != auStack_cf4._28_4_);
                            auStack_cf4._20_4_ = (int)CONCAT71((int7)((ulong)pNVar19 >> 8),1);
                            IVar10 = (ISEMode)auStack_cf4._44_8_;
                            pNVar20 = (NormalBlockISEInputs *)auStack_cf4._84_8_;
                            uVar26 = local_c58;
                            if (IVar10 < ISEMODE_PLAIN_BIT) {
                              anon_unknown_0::generateDefaultISEInputs
                                        (&local_c38,(NormalBlockParams *)local_d14);
                              local_c38.endpoint.isGivenInBlockForm = true;
                              uVar18 = (uint)(IVar10 == ISEMODE_TRIT) * 0x80;
                              uVar17 = (ulong)(uVar18 + 0x80);
                              bVar31 = (int)((ulong)(uint)auStack_cf4._80_4_ %
                                            (auStack_cf4._28_8_ & 0xffffffff)) != 0;
                              pNVar19 = (NormalBlockISEInputs *)(ulong)bVar31;
                              uVar9 = (uint)bVar31;
                              uVar22 = (int)((ulong)(uint)auStack_cf4._80_4_ /
                                            (auStack_cf4._28_8_ & 0xffffffff)) + uVar9;
                              auStack_cf4._44_4_ =
                                   ((int)((long)uVar17 / (long)(int)uVar22) + 1) -
                                   (uint)((int)((long)uVar17 % (long)(int)uVar22) == 0);
                              auStack_cf4._48_4_ = 0;
                              IVar10 = (ISEMode)auStack_cf4._28_8_;
                              _local_c98 = auStack_cf4._28_8_ & 0xffffffff;
                              uVar17 = (ulong)pNVar23 % (ulong)_local_c98;
                              _local_c90 = ZEXT48((int)((ulong)pNVar23 / (ulong)_local_c98) + uVar9)
                              ;
                              auStack_cf4._68_8_ = (NormalBlockISEInputs *)0x0;
                              do {
                                if (0 < (int)auStack_cf4._44_4_) {
                                  IVar13.mode = ISEMODE_TRIT;
                                  IVar13.numBits = 0;
                                  pNVar20 = (NormalBlockISEInputs *)auStack_cf4._68_8_;
                                  do {
                                    iVar28 = (int)uVar17;
                                    auStack_cf4._28_8_ = IVar13;
                                    if (0 < (int)uVar22) {
                                      __s = local_c38.endpoint.value.plain + 1;
                                      uVar17 = 0;
                                      do {
                                        memset(__s,0,(ulong)(IVar10 * 4));
                                        __s[-1] = (int)pNVar20 + (int)uVar17 & (uVar18 | 0x7f);
                                        uVar17 = uVar17 + 1;
                                        __s = __s + 6;
                                        iVar28 = extraout_EDX;
                                      } while (uVar17 < uVar22);
                                    }
                                    auStack_cf4._52_16_ =
                                         (undefined1  [16])
                                         anon_unknown_0::generateNormalBlock
                                                   ((NormalBlockParams *)local_d14,(int)&local_c38,
                                                    iVar28,pNVar19);
                                    dst_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)auStack_cf4._36_8_;
                                    anon_unknown_0::AssignBlock128::pushBytesToVector
                                              ((AssignBlock128 *)(auStack_cf4 + 0x34),
                                               (vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)auStack_cf4._36_8_);
                                    IVar13 = (ISEParams)(auStack_cf4._28_8_ + 1);
                                    pNVar20 = (NormalBlockISEInputs *)
                                              (&(pNVar20->weight).isGivenInBlockForm + _local_c90);
                                    uVar17 = extraout_RDX_02;
                                  } while ((ulong)IVar13 < (ulong)auStack_cf4._44_8_);
                                }
                                pNVar19 = (NormalBlockISEInputs *)(auStack_cf4._68_8_ + 1);
                                pNVar20 = (NormalBlockISEInputs *)auStack_cf4._84_8_;
                                uVar26 = local_c58;
                                auStack_cf4._68_8_ = pNVar19;
                              } while (pNVar19 != (NormalBlockISEInputs *)_local_c98);
                            }
                          }
                        }
                      } while (((auStack_cf4._20_8_ & 1) == 0) &&
                              (pNVar19 = (NormalBlockISEInputs *)(ulong)((uint)pNVar20 + 1),
                              (uint)pNVar20 < 0xc));
                    }
                  } while (((auStack_cf4._20_8_ & 1) == 0) &&
                          (uVar9 = (uint)local_c84._12_8_, local_c84._12_8_ = ZEXT48(uVar9 + 1),
                          uVar9 < 0xc));
                }
              } while (((auStack_cf4._20_8_ & 1) == 0) &&
                      (bVar31 = (ulong)local_c84._28_8_ < 0xb,
                      local_c84._28_8_ = local_c84._28_8_ + 1, bVar31));
            }
          } while (((auStack_cf4._20_8_ & 1) == 0) &&
                  (iVar28 = (int)local_c40, local_c40 = ZEXT48(iVar28 + 1), iVar28 == 0));
        }
        if ((auStack_cf4._20_8_ & 1) != 0) break;
        uVar9 = (uint)uVar26;
        pNVar23 = (NormalBlockISEInputs *)((long)&pNVar23->weight + 8);
        uVar26 = ZEXT48(uVar9 + 1);
      } while (uVar9 < 4);
      local_c50 = local_c50 + 1;
    } while (local_c50 != 0xb);
    break;
  case BLOCK_TEST_TYPE_CCS:
    iVar28 = 1;
    do {
      dVar27 = 0;
      do {
        auStack_cf4._4_4_ = 0;
        auStack_cf4._8_4_ = 0;
        local_d14._0_4_ = 3;
        local_d14._4_4_ = 3;
        local_d14._8_4_ = ISEMODE_PLAIN_BIT;
        local_d14._12_4_ = 2;
        local_d14[0x10] = true;
        local_d14._24_4_ = iVar28;
        local_d14._20_4_ = dVar27;
        auStack_cf4[0xc] = true;
        _local_cf8 = 8;
        auStack_cf4._16_4_ = 0x27a;
        anon_unknown_0::generateDefaultISEInputs(&local_c38,(NormalBlockParams *)local_d14);
        auStack_cf4._52_16_ =
             (undefined1  [16])
             anon_unknown_0::generateNormalBlock
                       ((NormalBlockParams *)local_d14,(int)&local_c38,blockHeight_03,
                        (NormalBlockISEInputs *)iseInputs_00);
        anon_unknown_0::AssignBlock128::pushBytesToVector
                  ((AssignBlock128 *)(auStack_cf4 + 0x34),
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_cf4._36_8_);
        dVar27 = dVar27 + 1;
      } while (dVar27 != 4);
      iVar28 = iVar28 + 1;
    } while (iVar28 != 4);
    break;
  case BLOCK_TEST_TYPE_RANDOM:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_cf4._36_8_,0x40000);
    generateRandomBlocks(*(deUint8 **)uVar26,0x4000,format,1);
  }
  return;
}

Assistant:

void generateBlockCaseTestData (vector<deUint8>& dst, CompressedTexFormat format, BlockTestType testType)
{
	DE_ASSERT(isAstcFormat(format));
	DE_ASSERT(!(isAstcSRGBFormat(format) && isBlockTestTypeHDROnly(testType)));

	const IVec3 blockSize = getBlockPixelSize(format);
	DE_ASSERT(blockSize.z() == 1);

	switch (testType)
	{
		case BLOCK_TEST_TYPE_VOID_EXTENT_LDR:
		// Generate a gradient-like set of LDR void-extent blocks.
		{
			const int			numBlocks	= 1<<13;
			const deUint32		numValues	= 1<<16;
			dst.reserve(numBlocks*BLOCK_SIZE_BYTES);

			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const deUint32 baseValue	= blockNdx*(numValues-1) / (numBlocks-1);
				const deUint16 r			= (deUint16)((baseValue + numValues*0/4) % numValues);
				const deUint16 g			= (deUint16)((baseValue + numValues*1/4) % numValues);
				const deUint16 b			= (deUint16)((baseValue + numValues*2/4) % numValues);
				const deUint16 a			= (deUint16)((baseValue + numValues*3/4) % numValues);
				AssignBlock128 block;

				generateVoidExtentBlock(VoidExtentParams(false, r, g, b, a)).pushBytesToVector(dst);
			}

			break;
		}

		case BLOCK_TEST_TYPE_VOID_EXTENT_HDR:
		// Generate a gradient-like set of HDR void-extent blocks, with values ranging from the largest finite negative to largest finite positive of fp16.
		{
			const float		minValue	= -65504.0f;
			const float		maxValue	= +65504.0f;
			const int		numBlocks	= 1<<13;
			dst.reserve(numBlocks*BLOCK_SIZE_BYTES);

			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const int			rNdx	= (blockNdx + numBlocks*0/4) % numBlocks;
				const int			gNdx	= (blockNdx + numBlocks*1/4) % numBlocks;
				const int			bNdx	= (blockNdx + numBlocks*2/4) % numBlocks;
				const int			aNdx	= (blockNdx + numBlocks*3/4) % numBlocks;
				const deFloat16		r		= deFloat32To16(minValue + (float)rNdx * (maxValue - minValue) / (float)(numBlocks-1));
				const deFloat16		g		= deFloat32To16(minValue + (float)gNdx * (maxValue - minValue) / (float)(numBlocks-1));
				const deFloat16		b		= deFloat32To16(minValue + (float)bNdx * (maxValue - minValue) / (float)(numBlocks-1));
				const deFloat16		a		= deFloat32To16(minValue + (float)aNdx * (maxValue - minValue) / (float)(numBlocks-1));

				generateVoidExtentBlock(VoidExtentParams(true, r, g, b, a)).pushBytesToVector(dst);
			}

			break;
		}

		case BLOCK_TEST_TYPE_WEIGHT_GRID:
		// Generate different combinations of plane count, weight ISE params, and grid size.
		{
			for (int isDualPlane = 0;		isDualPlane <= 1;												isDualPlane++)
			for (int iseParamsNdx = 0;		iseParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates);	iseParamsNdx++)
			for (int weightGridWidth = 2;	weightGridWidth <= 12;											weightGridWidth++)
			for (int weightGridHeight = 2;	weightGridHeight <= 12;											weightGridHeight++)
			{
				NormalBlockParams		blockParams;
				NormalBlockISEInputs	iseInputs;

				blockParams.weightGridWidth			= weightGridWidth;
				blockParams.weightGridHeight		= weightGridHeight;
				blockParams.isDualPlane				= isDualPlane != 0;
				blockParams.weightISEParams			= s_weightISEParamsCandidates[iseParamsNdx];
				blockParams.ccs						= 0;
				blockParams.numPartitions			= 1;
				blockParams.colorEndpointModes[0]	= 0;

				if (isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
					generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
			}

			break;
		}

		case BLOCK_TEST_TYPE_WEIGHT_ISE:
		// For each weight ISE param set, generate blocks that cover:
		// - each single value of the ISE's range, at each position inside an ISE block
		// - for trit and quint ISEs, each single T or Q value of an ISE block
		{
			for (int iseParamsNdx = 0;	iseParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates);	iseParamsNdx++)
			{
				const ISEParams&	iseParams = s_weightISEParamsCandidates[iseParamsNdx];
				NormalBlockParams	blockParams;

				blockParams.weightGridWidth			= 4;
				blockParams.weightGridHeight		= 4;
				blockParams.weightISEParams			= iseParams;
				blockParams.numPartitions			= 1;
				blockParams.isDualPlane				= blockParams.weightGridWidth * blockParams.weightGridHeight < 24 ? true : false;
				blockParams.ccs						= 0;
				blockParams.colorEndpointModes[0]	= 0;

				while (!isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
				{
					blockParams.weightGridWidth--;
					blockParams.weightGridHeight--;
				}

				const int numValuesInISEBlock	= iseParams.mode == ISEMODE_TRIT ? 5 : iseParams.mode == ISEMODE_QUINT ? 3 : 1;
				const int numWeights			= computeNumWeights(blockParams);

				{
					const int				numWeightValues		= (int)computeISERangeMax(iseParams) + 1;
					const int				numBlocks			= deDivRoundUp32(numWeightValues, numWeights);
					NormalBlockISEInputs	iseInputs			= generateDefaultISEInputs(blockParams);
					iseInputs.weight.isGivenInBlockForm = false;

					for (int offset = 0;	offset < numValuesInISEBlock;	offset++)
					for (int blockNdx = 0;	blockNdx < numBlocks;			blockNdx++)
					{
						for (int weightNdx = 0; weightNdx < numWeights; weightNdx++)
							iseInputs.weight.value.plain[weightNdx] = (blockNdx*numWeights + weightNdx + offset) % numWeightValues;

						generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
					}
				}

				if (iseParams.mode == ISEMODE_TRIT || iseParams.mode == ISEMODE_QUINT)
				{
					NormalBlockISEInputs iseInputs = generateDefaultISEInputs(blockParams);
					iseInputs.weight.isGivenInBlockForm = true;

					const int numTQValues			= 1 << (iseParams.mode == ISEMODE_TRIT ? 8 : 7);
					const int numISEBlocksPerBlock	= deDivRoundUp32(numWeights, numValuesInISEBlock);
					const int numBlocks				= deDivRoundUp32(numTQValues, numISEBlocksPerBlock);

					for (int offset = 0;	offset < numValuesInISEBlock;	offset++)
					for (int blockNdx = 0;	blockNdx < numBlocks;			blockNdx++)
					{
						for (int iseBlockNdx = 0; iseBlockNdx < numISEBlocksPerBlock; iseBlockNdx++)
						{
							for (int i = 0; i < numValuesInISEBlock; i++)
								iseInputs.weight.value.block[iseBlockNdx].bitValues[i] = 0;
							iseInputs.weight.value.block[iseBlockNdx].tOrQValue = (blockNdx*numISEBlocksPerBlock + iseBlockNdx + offset) % numTQValues;
						}

						generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
					}
				}
			}

			break;
		}

		case BLOCK_TEST_TYPE_CEMS:
		// For each plane count & partition count combination, generate all color endpoint mode combinations.
		{
			for (int isDualPlane = 0;		isDualPlane <= 1;								isDualPlane++)
			for (int numPartitions = 1;		numPartitions <= (isDualPlane != 0 ? 3 : 4);	numPartitions++)
			{
				// Multi-partition, single-CEM mode.
				if (numPartitions > 1)
				{
					for (deUint32 singleCem = 0; singleCem < 16; singleCem++)
					{
						NormalBlockParams blockParams;
						blockParams.weightGridWidth				= 4;
						blockParams.weightGridHeight			= 4;
						blockParams.isDualPlane					= isDualPlane != 0;
						blockParams.ccs							= 0;
						blockParams.numPartitions				= numPartitions;
						blockParams.isMultiPartSingleCemMode	= true;
						blockParams.colorEndpointModes[0]		= singleCem;
						blockParams.partitionSeed				= 634;

						for (int iseParamsNdx = 0; iseParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates); iseParamsNdx++)
						{
							blockParams.weightISEParams = s_weightISEParamsCandidates[iseParamsNdx];
							if (isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
							{
								generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
								break;
							}
						}
					}
				}

				// Separate-CEM mode.
				for (deUint32 cem0 = 0; cem0 < 16; cem0++)
				for (deUint32 cem1 = 0; cem1 < (numPartitions >= 2 ? 16u : 1u); cem1++)
				for (deUint32 cem2 = 0; cem2 < (numPartitions >= 3 ? 16u : 1u); cem2++)
				for (deUint32 cem3 = 0; cem3 < (numPartitions >= 4 ? 16u : 1u); cem3++)
				{
					NormalBlockParams blockParams;
					blockParams.weightGridWidth				= 4;
					blockParams.weightGridHeight			= 4;
					blockParams.isDualPlane					= isDualPlane != 0;
					blockParams.ccs							= 0;
					blockParams.numPartitions				= numPartitions;
					blockParams.isMultiPartSingleCemMode	= false;
					blockParams.colorEndpointModes[0]		= cem0;
					blockParams.colorEndpointModes[1]		= cem1;
					blockParams.colorEndpointModes[2]		= cem2;
					blockParams.colorEndpointModes[3]		= cem3;
					blockParams.partitionSeed				= 634;

					{
						const deUint32 minCem		= *std::min_element(&blockParams.colorEndpointModes[0], &blockParams.colorEndpointModes[numPartitions]);
						const deUint32 maxCem		= *std::max_element(&blockParams.colorEndpointModes[0], &blockParams.colorEndpointModes[numPartitions]);
						const deUint32 minCemClass	= minCem/4;
						const deUint32 maxCemClass	= maxCem/4;

						if (maxCemClass - minCemClass > 1)
							continue;
					}

					for (int iseParamsNdx = 0; iseParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates); iseParamsNdx++)
					{
						blockParams.weightISEParams = s_weightISEParamsCandidates[iseParamsNdx];
						if (isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
						{
							generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
							break;
						}
					}
				}
			}

			break;
		}

		case BLOCK_TEST_TYPE_PARTITION_SEED:
		// Test all partition seeds ("partition pattern indices").
		{
			for (int		numPartitions = 2;	numPartitions <= 4;		numPartitions++)
			for (deUint32	partitionSeed = 0;	partitionSeed < 1<<10;	partitionSeed++)
			{
				NormalBlockParams blockParams;
				blockParams.weightGridWidth				= 4;
				blockParams.weightGridHeight			= 4;
				blockParams.weightISEParams				= ISEParams(ISEMODE_PLAIN_BIT, 2);
				blockParams.isDualPlane					= false;
				blockParams.numPartitions				= numPartitions;
				blockParams.isMultiPartSingleCemMode	= true;
				blockParams.colorEndpointModes[0]		= 0;
				blockParams.partitionSeed				= partitionSeed;

				generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
			}

			break;
		}

		// \note Fall-through.
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR:
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15:
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15:
		// For each endpoint mode, for each pair of components in the endpoint value, test 10x10 combinations of values for that pair.
		// \note Separate modes for HDR and mode 15 due to different color scales and biases.
		{
			for (deUint32 cem = 0; cem < 16; cem++)
			{
				const bool isHDRCem = cem == 2		||
									  cem == 3		||
									  cem == 7		||
									  cem == 11		||
									  cem == 14		||
									  cem == 15;

				if ((testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR			&& isHDRCem)					||
					(testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15		&& (!isHDRCem || cem == 15))	||
					(testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15		&& cem != 15))
					continue;

				NormalBlockParams blockParams;
				blockParams.weightGridWidth			= 3;
				blockParams.weightGridHeight		= 4;
				blockParams.weightISEParams			= ISEParams(ISEMODE_PLAIN_BIT, 2);
				blockParams.isDualPlane				= false;
				blockParams.numPartitions			= 1;
				blockParams.colorEndpointModes[0]	= cem;

				{
					const int			numBitsForEndpoints		= computeNumBitsForColorEndpoints(blockParams);
					const int			numEndpointParts		= computeNumColorEndpointValues(cem);
					const ISEParams		endpointISE				= computeMaximumRangeISEParams(numBitsForEndpoints, numEndpointParts);
					const int			endpointISERangeMax		= computeISERangeMax(endpointISE);

					for (int endpointPartNdx0 = 0;						endpointPartNdx0 < numEndpointParts; endpointPartNdx0++)
					for (int endpointPartNdx1 = endpointPartNdx0+1;		endpointPartNdx1 < numEndpointParts; endpointPartNdx1++)
					{
						NormalBlockISEInputs	iseInputs			= generateDefaultISEInputs(blockParams);
						const int				numEndpointValues	= de::min(10, endpointISERangeMax+1);

						for (int endpointValueNdx0 = 0; endpointValueNdx0 < numEndpointValues; endpointValueNdx0++)
						for (int endpointValueNdx1 = 0; endpointValueNdx1 < numEndpointValues; endpointValueNdx1++)
						{
							const int endpointValue0 = endpointValueNdx0 * endpointISERangeMax / (numEndpointValues-1);
							const int endpointValue1 = endpointValueNdx1 * endpointISERangeMax / (numEndpointValues-1);

							iseInputs.endpoint.value.plain[endpointPartNdx0] = endpointValue0;
							iseInputs.endpoint.value.plain[endpointPartNdx1] = endpointValue1;

							generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
						}
					}
				}
			}

			break;
		}

		case BLOCK_TEST_TYPE_ENDPOINT_ISE:
		// Similar to BLOCK_TEST_TYPE_WEIGHT_ISE, see above.
		{
			static const deUint32 endpointRangeMaximums[] = { 5, 9, 11, 19, 23, 39, 47, 79, 95, 159, 191 };

			for (int endpointRangeNdx = 0; endpointRangeNdx < DE_LENGTH_OF_ARRAY(endpointRangeMaximums); endpointRangeNdx++)
			{
				bool validCaseGenerated = false;

				for (int numPartitions = 1;			!validCaseGenerated && numPartitions <= 4;														numPartitions++)
				for (int isDual = 0;				!validCaseGenerated && isDual <= 1;																isDual++)
				for (int weightISEParamsNdx = 0;	!validCaseGenerated && weightISEParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates);	weightISEParamsNdx++)
				for (int weightGridWidth = 2;		!validCaseGenerated && weightGridWidth <= 12;													weightGridWidth++)
				for (int weightGridHeight = 2;		!validCaseGenerated && weightGridHeight <= 12;													weightGridHeight++)
				{
					NormalBlockParams blockParams;
					blockParams.weightGridWidth				= weightGridWidth;
					blockParams.weightGridHeight			= weightGridHeight;
					blockParams.weightISEParams				= s_weightISEParamsCandidates[weightISEParamsNdx];
					blockParams.isDualPlane					= isDual != 0;
					blockParams.ccs							= 0;
					blockParams.numPartitions				= numPartitions;
					blockParams.isMultiPartSingleCemMode	= true;
					blockParams.colorEndpointModes[0]		= 12;
					blockParams.partitionSeed				= 634;

					if (isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
					{
						const ISEParams endpointISEParams = computeMaximumRangeISEParams(computeNumBitsForColorEndpoints(blockParams),
																						 computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], numPartitions, true));

						if (computeISERangeMax(endpointISEParams) == endpointRangeMaximums[endpointRangeNdx])
						{
							validCaseGenerated = true;

							const int numColorEndpoints		= computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], numPartitions, blockParams.isMultiPartSingleCemMode);
							const int numValuesInISEBlock	= endpointISEParams.mode == ISEMODE_TRIT ? 5 : endpointISEParams.mode == ISEMODE_QUINT ? 3 : 1;

							{
								const int				numColorEndpointValues	= (int)computeISERangeMax(endpointISEParams) + 1;
								const int				numBlocks				= deDivRoundUp32(numColorEndpointValues, numColorEndpoints);
								NormalBlockISEInputs	iseInputs				= generateDefaultISEInputs(blockParams);
								iseInputs.endpoint.isGivenInBlockForm = false;

								for (int offset = 0;	offset < numValuesInISEBlock;	offset++)
								for (int blockNdx = 0;	blockNdx < numBlocks;			blockNdx++)
								{
									for (int endpointNdx = 0; endpointNdx < numColorEndpoints; endpointNdx++)
										iseInputs.endpoint.value.plain[endpointNdx] = (blockNdx*numColorEndpoints + endpointNdx + offset) % numColorEndpointValues;

									generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
								}
							}

							if (endpointISEParams.mode == ISEMODE_TRIT || endpointISEParams.mode == ISEMODE_QUINT)
							{
								NormalBlockISEInputs iseInputs = generateDefaultISEInputs(blockParams);
								iseInputs.endpoint.isGivenInBlockForm = true;

								const int numTQValues			= 1 << (endpointISEParams.mode == ISEMODE_TRIT ? 8 : 7);
								const int numISEBlocksPerBlock	= deDivRoundUp32(numColorEndpoints, numValuesInISEBlock);
								const int numBlocks				= deDivRoundUp32(numTQValues, numISEBlocksPerBlock);

								for (int offset = 0;	offset < numValuesInISEBlock;	offset++)
								for (int blockNdx = 0;	blockNdx < numBlocks;			blockNdx++)
								{
									for (int iseBlockNdx = 0; iseBlockNdx < numISEBlocksPerBlock; iseBlockNdx++)
									{
										for (int i = 0; i < numValuesInISEBlock; i++)
											iseInputs.endpoint.value.block[iseBlockNdx].bitValues[i] = 0;
										iseInputs.endpoint.value.block[iseBlockNdx].tOrQValue = (blockNdx*numISEBlocksPerBlock + iseBlockNdx + offset) % numTQValues;
									}

									generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
								}
							}
						}
					}
				}

				DE_ASSERT(validCaseGenerated);
			}

			break;
		}

		case BLOCK_TEST_TYPE_CCS:
		// For all partition counts, test all values of the CCS (color component selector).
		{
			for (int		numPartitions = 1;		numPartitions <= 3;		numPartitions++)
			for (deUint32	ccs = 0;				ccs < 4;				ccs++)
			{
				NormalBlockParams blockParams;
				blockParams.weightGridWidth				= 3;
				blockParams.weightGridHeight			= 3;
				blockParams.weightISEParams				= ISEParams(ISEMODE_PLAIN_BIT, 2);
				blockParams.isDualPlane					= true;
				blockParams.ccs							= ccs;
				blockParams.numPartitions				= numPartitions;
				blockParams.isMultiPartSingleCemMode	= true;
				blockParams.colorEndpointModes[0]		= 8;
				blockParams.partitionSeed				= 634;

				generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
			}

			break;
		}

		case BLOCK_TEST_TYPE_RANDOM:
		// Generate a number of random (including invalid) blocks.
		{
			const int		numBlocks	= 16384;
			const deUint32	seed		= 1;

			dst.resize(numBlocks*BLOCK_SIZE_BYTES);

			generateRandomBlocks(&dst[0], numBlocks, format, seed);

			break;
		}

		default:
			DE_ASSERT(false);
	}
}